

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenTableBuilders
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  size_type *psVar1;
  Value *type;
  BaseType BVar2;
  FieldDef *pFVar3;
  long *plVar4;
  undefined8 *puVar5;
  pointer ppFVar6;
  size_t t;
  size_t t_00;
  ulong *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer ppFVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  undefined8 uVar12;
  pointer ppFVar13;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  string local_2b0;
  _Alloc_hider local_290;
  StructDef *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_280;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  string local_250;
  LobsterGenerator *local_230;
  string local_228;
  string *local_208;
  string local_200;
  StructDef *local_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  pointer local_38;
  
  local_230 = this;
  local_208 = code_ptr;
  local_1e0 = struct_def;
  EscapeKeyword(&local_2b0,this,(string *)struct_def);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x35de42);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_2c0 = *puVar7;
    lStack_2b8 = plVar4[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar7;
    local_2d0 = (ulong *)*plVar4;
  }
  local_2c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 == paVar8) {
    aStack_280._M_allocated_capacity = paVar8->_M_allocated_capacity;
    aStack_280._8_8_ = puVar5[3];
    local_290._M_p = (pointer)&aStack_280;
  }
  else {
    aStack_280._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_290._M_p = (pointer)*puVar5;
  }
  local_288 = (StructDef *)puVar5[1];
  *puVar5 = paVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &aStack_280) {
    operator_delete(local_290._M_p,aStack_280._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>
            (&local_2b0,
             (long)(local_1e0->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1e0->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x37243c);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_2c0 = *puVar7;
    lStack_2b8 = plVar4[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar7;
    local_2d0 = (ulong *)*plVar4;
  }
  local_2c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 == paVar8) {
    aStack_280._M_allocated_capacity = paVar8->_M_allocated_capacity;
    aStack_280._8_8_ = puVar5[3];
    local_290._M_p = (pointer)&aStack_280;
  }
  else {
    aStack_280._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_290._M_p = (pointer)*puVar5;
  }
  local_288 = (StructDef *)puVar5[1];
  *puVar5 = paVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &aStack_280) {
    operator_delete(local_290._M_p,(ulong)(aStack_280._M_allocated_capacity + 1));
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  ppFVar9 = (local_1e0->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar6 = (local_1e0->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar9 != ppFVar6) {
    paVar8 = &local_250.field_2;
    ppFVar13 = ppFVar9;
    do {
      pFVar3 = *ppFVar13;
      if (pFVar3->deprecated == false) {
        ppFVar6 = (local_1e0->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_38 = ppFVar9;
        EscapeKeyword(&local_f8,local_230,(string *)pFVar3);
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x37247c);
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_168 = *plVar4;
          uStack_160 = puVar5[3];
          local_178 = &local_168;
        }
        else {
          local_168 = *plVar4;
          local_178 = (long *)*puVar5;
        }
        local_170 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
        local_1d8 = &local_1c8;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_1c8 = *puVar7;
          lStack_1c0 = plVar4[3];
        }
        else {
          local_1c8 = *puVar7;
          local_1d8 = (ulong *)*plVar4;
        }
        local_1d0 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        EscapeKeyword(&local_118,local_230,(string *)pFVar3);
        uVar11 = 0xf;
        if (local_1d8 != &local_1c8) {
          uVar11 = local_1c8;
        }
        if (uVar11 < local_118._M_string_length + local_1d0) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            uVar12 = local_118.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_118._M_string_length + local_1d0) goto LAB_0029e2fe;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_1d8);
        }
        else {
LAB_0029e2fe:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1d8,(ulong)local_118._M_dataplus._M_p);
        }
        local_1b8 = &local_1a8;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_1a8 = *plVar4;
          uStack_1a0 = puVar5[3];
        }
        else {
          local_1a8 = *plVar4;
          local_1b8 = (long *)*puVar5;
        }
        local_1b0 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
        local_198 = &local_188;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_188 = *puVar7;
          lStack_180 = plVar4[3];
        }
        else {
          local_188 = *puVar7;
          local_198 = (ulong *)*plVar4;
        }
        local_190 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        type = &pFVar3->value;
        LobsterType_abi_cxx11_(&local_b8,local_230,&type->type);
        uVar11 = 0xf;
        if (local_198 != &local_188) {
          uVar11 = local_188;
        }
        if (uVar11 < local_b8._M_string_length + local_190) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            uVar12 = local_b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_b8._M_string_length + local_190) goto LAB_0029e45f;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_198);
        }
        else {
LAB_0029e45f:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_198,(ulong)local_b8._M_dataplus._M_p);
        }
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        psVar1 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_200.field_2._M_allocated_capacity = *psVar1;
          local_200.field_2._8_8_ = puVar5[3];
        }
        else {
          local_200.field_2._M_allocated_capacity = *psVar1;
          local_200._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_200._M_string_length = puVar5[1];
        *puVar5 = psVar1;
        puVar5[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
        puVar7 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_250.field_2._M_allocated_capacity = *puVar7;
          local_250.field_2._8_8_ = plVar4[3];
          local_250._M_dataplus._M_p = (pointer)paVar8;
        }
        else {
          local_250.field_2._M_allocated_capacity = *puVar7;
          local_250._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_250._M_string_length = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        GenMethod_abi_cxx11_(&local_138,local_230,&type->type);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar8) {
          uVar12 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_138._M_string_length + local_250._M_string_length) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar12 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_138._M_string_length + local_250._M_string_length)
          goto LAB_0029e5aa;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_138,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
        }
        else {
LAB_0029e5aa:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_250,(ulong)local_138._M_dataplus._M_p);
        }
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        psVar1 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_228.field_2._M_allocated_capacity = *psVar1;
          local_228.field_2._8_8_ = puVar5[3];
        }
        else {
          local_228.field_2._M_allocated_capacity = *psVar1;
          local_228._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_228._M_string_length = puVar5[1];
        *puVar5 = psVar1;
        puVar5[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
        local_270 = &local_260;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_260 = *puVar7;
          lStack_258 = plVar4[3];
        }
        else {
          local_260 = *puVar7;
          local_270 = (ulong *)*plVar4;
        }
        local_268 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        NumToString<long>(&local_d8,(long)ppFVar9 - (long)ppFVar6 >> 3);
        uVar11 = 0xf;
        if (local_270 != &local_260) {
          uVar11 = local_260;
        }
        if (uVar11 < local_d8._M_string_length + local_268) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            uVar12 = local_d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_d8._M_string_length + local_268) goto LAB_0029e6ea;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_270);
        }
        else {
LAB_0029e6ea:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_d8._M_dataplus._M_p);
        }
        psVar1 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0.field_2._8_8_ = puVar5[3];
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_2b0._M_string_length = puVar5[1];
        *puVar5 = psVar1;
        puVar5[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_2d0 = &local_2c0;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_2c0 = *puVar7;
          lStack_2b8 = plVar4[3];
        }
        else {
          local_2c0 = *puVar7;
          local_2d0 = (ulong *)*plVar4;
        }
        local_2c8 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        EscapeKeyword(&local_158,local_230,(string *)pFVar3);
        uVar11 = 0xf;
        if (local_2d0 != &local_2c0) {
          uVar11 = local_2c0;
        }
        if (uVar11 < local_158._M_string_length + local_2c8) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            uVar12 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_158._M_string_length + local_2c8) goto LAB_0029e811;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_2d0);
        }
        else {
LAB_0029e811:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2d0,(ulong)local_158._M_dataplus._M_p);
        }
        local_290._M_p = (pointer)&aStack_280;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 == paVar10) {
          aStack_280._M_allocated_capacity = paVar10->_M_allocated_capacity;
          aStack_280._8_8_ = puVar5[3];
        }
        else {
          aStack_280._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_290._M_p = (pointer)*puVar5;
        }
        local_288 = (StructDef *)puVar5[1];
        *puVar5 = paVar10;
        puVar5[1] = 0;
        paVar10->_M_local_buf[0] = '\0';
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_p != &aStack_280) {
          operator_delete(local_290._M_p,(ulong)(aStack_280._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar8) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (((type->type).base_type - BASE_TYPE_UTYPE < 0xc) && (pFVar3->presence != kOptional)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_290,", ",&(pFVar3->value).constant);
          std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_p != &aStack_280) {
            operator_delete(local_290._M_p,(ulong)(aStack_280._M_allocated_capacity + 1));
          }
        }
        std::__cxx11::string::append((char *)local_208);
        ppFVar6 = (local_1e0->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppFVar9 = local_38;
      }
      ppFVar13 = ppFVar13 + 1;
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar13 != ppFVar6);
  }
  std::__cxx11::string::append((char *)local_208);
  ppFVar9 = (local_1e0->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar6 = (local_1e0->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar9 != ppFVar6) {
    do {
      paVar8 = &local_2b0.field_2;
      pFVar3 = *ppFVar9;
      if ((pFVar3->deprecated == false) &&
         ((BVar2 = (pFVar3->value).type.base_type, BVar2 == BASE_TYPE_VECTOR64 ||
          (BVar2 == BASE_TYPE_VECTOR)))) {
        EscapeKeyword(&local_228,local_230,(string *)local_1e0);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x372070);
        local_270 = &local_260;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_260 = *puVar7;
          lStack_258 = plVar4[3];
        }
        else {
          local_260 = *puVar7;
          local_270 = (ulong *)*plVar4;
        }
        local_268 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
        puVar7 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0.field_2._8_8_ = plVar4[3];
          local_2b0._M_dataplus._M_p = (pointer)paVar8;
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_2b0._M_string_length = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        EscapeKeyword(&local_200,local_230,(string *)pFVar3);
        ConvertCase(&local_250,&local_200,kUpperCamel,kSnake);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar8) {
          uVar12 = local_2b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_250._M_string_length + local_2b0._M_string_length) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar12 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_250._M_string_length + local_2b0._M_string_length)
          goto LAB_0029ed33;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_250,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
        }
        else {
LAB_0029ed33:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)local_250._M_dataplus._M_p);
        }
        local_2d0 = &local_2c0;
        puVar7 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar7) {
          local_2c0 = *puVar7;
          lStack_2b8 = puVar5[3];
        }
        else {
          local_2c0 = *puVar7;
          local_2d0 = (ulong *)*puVar5;
        }
        local_2c8 = puVar5[1];
        *puVar5 = puVar7;
        puVar5[1] = 0;
        *(undefined1 *)puVar7 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 == paVar10) {
          aStack_280._M_allocated_capacity = paVar10->_M_allocated_capacity;
          aStack_280._8_8_ = plVar4[3];
          local_290._M_p = (pointer)&aStack_280;
        }
        else {
          aStack_280._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_290._M_p = (pointer)*plVar4;
        }
        local_288 = (StructDef *)plVar4[1];
        *plVar4 = (long)paVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_290._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_p != &aStack_280) {
          operator_delete(local_290._M_p,aStack_280._M_allocated_capacity + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != paVar8) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        local_290._M_p._4_4_ = 0;
        local_290._M_p._0_4_ = (pFVar3->value).type.element;
        local_288 = (pFVar3->value).type.struct_def;
        aStack_280._M_allocated_capacity = (size_type)(pFVar3->value).type.enum_def;
        aStack_280._8_2_ = (pFVar3->value).type.fixed_length;
        t = InlineAlignment((Type *)&local_290);
        t_00 = InlineSize((Type *)&local_290);
        NumToString<unsigned_long>(&local_228,t_00);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
        local_270 = &local_260;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_260 = *puVar7;
          lStack_258 = plVar4[3];
        }
        else {
          local_260 = *puVar7;
          local_270 = (ulong *)*plVar4;
        }
        local_268 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        NumToString<unsigned_long>(&local_250,t);
        uVar11 = 0xf;
        if (local_270 != &local_260) {
          uVar11 = local_260;
        }
        if (uVar11 < local_250._M_string_length + local_268) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar12 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_250._M_string_length + local_268) goto LAB_0029efe8;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_270);
        }
        else {
LAB_0029efe8:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)local_250._M_dataplus._M_p);
        }
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        psVar1 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0.field_2._8_8_ = puVar5[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *psVar1;
          local_2b0._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_2b0._M_string_length = puVar5[1];
        *puVar5 = psVar1;
        puVar5[1] = 0;
        *(undefined1 *)psVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_2d0 = &local_2c0;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_2c0 = *puVar7;
          lStack_2b8 = plVar4[3];
        }
        else {
          local_2c0 = *puVar7;
          local_2d0 = (ulong *)*plVar4;
        }
        local_2c8 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_208,(ulong)local_2d0);
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (((BaseType)local_290._M_p != BASE_TYPE_STRUCT) || (local_288->fixed == false)) {
          EscapeKeyword(&local_b8,local_230,(string *)local_1e0);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x372070);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          puVar7 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_118.field_2._M_allocated_capacity = *puVar7;
            local_118.field_2._8_8_ = plVar4[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar7;
            local_118._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_118._M_string_length = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          puVar7 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_f8.field_2._M_allocated_capacity = *puVar7;
            local_f8.field_2._8_8_ = plVar4[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *puVar7;
            local_f8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_f8._M_string_length = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          EscapeKeyword(&local_d8,local_230,(string *)pFVar3);
          ConvertCase(&local_138,&local_d8,kUpperCamel,kSnake);
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar12 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_138._M_string_length + local_f8._M_string_length) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              uVar12 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_138._M_string_length + local_f8._M_string_length)
            goto LAB_0029f300;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_138,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
          }
          else {
LAB_0029f300:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_138._M_dataplus._M_p);
          }
          local_178 = &local_168;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_168 = *plVar4;
            uStack_160 = puVar5[3];
          }
          else {
            local_168 = *plVar4;
            local_178 = (long *)*puVar5;
          }
          local_170 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
          local_1d8 = &local_1c8;
          puVar7 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar7) {
            local_1c8 = *puVar7;
            lStack_1c0 = plVar4[3];
          }
          else {
            local_1c8 = *puVar7;
            local_1d8 = (ulong *)*plVar4;
          }
          local_1d0 = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          LobsterType_abi_cxx11_(&local_158,local_230,(Type *)&local_290);
          uVar11 = 0xf;
          if (local_1d8 != &local_1c8) {
            uVar11 = local_1c8;
          }
          if (uVar11 < local_158._M_string_length + local_1d0) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              uVar12 = local_158.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_158._M_string_length + local_1d0) goto LAB_0029f45a;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_1d8)
            ;
          }
          else {
LAB_0029f45a:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1d8,(ulong)local_158._M_dataplus._M_p);
          }
          local_1b8 = &local_1a8;
          plVar4 = puVar5 + 2;
          if ((long *)*puVar5 == plVar4) {
            local_1a8 = *plVar4;
            uStack_1a0 = puVar5[3];
          }
          else {
            local_1a8 = *plVar4;
            local_1b8 = (long *)*puVar5;
          }
          local_1b0 = puVar5[1];
          *puVar5 = plVar4;
          puVar5[1] = 0;
          *(undefined1 *)plVar4 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          local_198 = &local_188;
          puVar7 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar7) {
            local_188 = *puVar7;
            lStack_180 = plVar4[3];
          }
          else {
            local_188 = *puVar7;
            local_198 = (ulong *)*plVar4;
          }
          local_190 = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          NumToString<unsigned_long>(&local_58,t_00);
          uVar11 = 0xf;
          if (local_198 != &local_188) {
            uVar11 = local_188;
          }
          if (uVar11 < local_58._M_string_length + local_190) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              uVar12 = local_58.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_58._M_string_length + local_190) goto LAB_0029f5b9;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_198);
          }
          else {
LAB_0029f5b9:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_198,(ulong)local_58._M_dataplus._M_p);
          }
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          psVar1 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_200.field_2._M_allocated_capacity = *psVar1;
            local_200.field_2._8_8_ = puVar5[3];
          }
          else {
            local_200.field_2._M_allocated_capacity = *psVar1;
            local_200._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_200._M_string_length = puVar5[1];
          *puVar5 = psVar1;
          puVar5[1] = 0;
          *(undefined1 *)psVar1 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
          puVar7 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_250.field_2._M_allocated_capacity = *puVar7;
            local_250.field_2._8_8_ = plVar4[3];
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          }
          else {
            local_250.field_2._M_allocated_capacity = *puVar7;
            local_250._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_250._M_string_length = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          NumToString<unsigned_long>(&local_78,t);
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar12 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_78._M_string_length + local_250._M_string_length) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              uVar12 = local_78.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_78._M_string_length + local_250._M_string_length)
            goto LAB_0029f70a;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_78,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
          }
          else {
LAB_0029f70a:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_250,(ulong)local_78._M_dataplus._M_p);
          }
          psVar1 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_228.field_2._M_allocated_capacity = *psVar1;
            local_228.field_2._8_8_ = puVar5[3];
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          }
          else {
            local_228.field_2._M_allocated_capacity = *psVar1;
            local_228._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_228._M_string_length = puVar5[1];
          *puVar5 = psVar1;
          puVar5[1] = 0;
          *(undefined1 *)psVar1 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
          local_270 = &local_260;
          puVar7 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar7) {
            local_260 = *puVar7;
            lStack_258 = plVar4[3];
          }
          else {
            local_260 = *puVar7;
            local_270 = (ulong *)*plVar4;
          }
          local_268 = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          GenMethod_abi_cxx11_(&local_98,local_230,(Type *)&local_290);
          uVar11 = 0xf;
          if (local_270 != &local_260) {
            uVar11 = local_260;
          }
          if (uVar11 < local_98._M_string_length + local_268) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              uVar12 = local_98.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_98._M_string_length + local_268) goto LAB_0029f842;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_270);
          }
          else {
LAB_0029f842:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_270,(ulong)local_98._M_dataplus._M_p);
          }
          psVar1 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_2b0.field_2._M_allocated_capacity = *psVar1;
            local_2b0.field_2._8_8_ = puVar5[3];
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *psVar1;
            local_2b0._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_2b0._M_string_length = puVar5[1];
          *puVar5 = psVar1;
          puVar5[1] = 0;
          *(undefined1 *)psVar1 = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          puVar7 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar7) {
            local_2c0 = *puVar7;
            lStack_2b8 = plVar4[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0 = *puVar7;
            local_2d0 = (ulong *)*plVar4;
          }
          local_2c8 = plVar4[1];
          *plVar4 = (long)puVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_208,(ulong)local_2d0);
          if (local_2d0 != &local_2c0) {
            operator_delete(local_2d0,local_2c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if (local_198 != &local_188) {
            operator_delete(local_198,local_188 + 1);
          }
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,local_1a8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,local_1c8 + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)local_208);
        ppFVar6 = (local_1e0->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != ppFVar6);
  }
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "struct " + NormalizedName(struct_def) +
            "Builder:\n    b_:flatbuffers.builder\n";
    code += "    def start():\n        b_.StartObject(" +
            NumToString(struct_def.fields.vec.size()) +
            ")\n        return this\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto offset = it - struct_def.fields.vec.begin();
      code += "    def add_" + NormalizedName(field) + "(" +
              NormalizedName(field) + ":" + LobsterType(field.value.type) +
              "):\n        b_.Prepend" + GenMethod(field.value.type) + "Slot(" +
              NumToString(offset) + ", " + NormalizedName(field);
      if (IsScalar(field.value.type.base_type) && !field.IsOptional())
        code += ", " + field.value.constant;
      code += ")\n        return this\n";
    }
    code += "    def end():\n        return b_.EndObject()\n\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsVector(field.value.type)) {
        code += "def " + NormalizedName(struct_def) + "Start" +
                ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                "Vector(b_:flatbuffers.builder, n_:int):\n    b_.StartVector(";
        auto vector_type = field.value.type.VectorType();
        auto alignment = InlineAlignment(vector_type);
        auto elem_size = InlineSize(vector_type);
        code +=
            NumToString(elem_size) + ", n_, " + NumToString(alignment) + ")\n";
        if (vector_type.base_type != BASE_TYPE_STRUCT ||
            !vector_type.struct_def->fixed) {
          code += "def " + NormalizedName(struct_def) + "Create" +
                  ConvertCase(NormalizedName(field), Case::kUpperCamel) +
                  "Vector(b_:flatbuffers.builder, v_:[" +
                  LobsterType(vector_type) + "]):\n    b_.StartVector(" +
                  NumToString(elem_size) + ", v_.length, " +
                  NumToString(alignment) + ")\n    reverse(v_) e_: b_.Prepend" +
                  GenMethod(vector_type) +
                  "(e_)\n    return b_.EndVector(v_.length)\n";
        }
        code += "\n";
      }
    }
  }